

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O2

void llb_build_value_get_file_infos
               (llb_build_value *value,void *context,
               _func_void_void_ptr_llb_build_value_file_info_t *iterator)

{
  llb_build_value_file_info_t lVar1;
  uint uVar2;
  FileInfo *pFVar3;
  uint index;
  uint n;
  
  uVar2 = llbuild::buildsystem::BuildValue::getNumOutputs((BuildValue *)value);
  for (n = 0; uVar2 != n; n = n + 1) {
    pFVar3 = llbuild::buildsystem::BuildValue::getNthOutputInfo((BuildValue *)value,n);
    lVar1.device = pFVar3->device;
    lVar1.inode = pFVar3->inode;
    lVar1.mode = pFVar3->mode;
    lVar1.size = pFVar3->size;
    lVar1.modTime.seconds = (pFVar3->modTime).seconds;
    lVar1.modTime.nanoseconds = (pFVar3->modTime).nanoseconds;
    (*iterator)(context,lVar1);
  }
  return;
}

Assistant:

void llb_build_value_get_file_infos(llb_build_value *_Nonnull value, void *_Nullable context, void (*_Nonnull iterator)(void *_Nullable context, llb_build_value_file_info_t fileInfo)) {
  auto internalBuildValue = &((CAPIBuildValue *)value)->getInternalBuildValue();
  auto count = internalBuildValue->getNumOutputs();
  for (unsigned index = 0; index < count; index++) {
    auto fileInfo = internalBuildValue->getNthOutputInfo(index);
    iterator(context, llbuild::capi::convertFileInfo(fileInfo));
  }
}